

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift_reduce_parser.cpp
# Opt level: O1

JsonValue * __thiscall MercuryJson::JSON::_shift_reduce_parsing(JSON *this)

{
  ParseStack *pPVar1;
  byte args;
  size_t sVar2;
  JsonPartialValue *pJVar3;
  JsonObject *pJVar4;
  JsonValue *pJVar5;
  pointer this_00;
  bool bVar6;
  long lVar7;
  JsonPartialValue *pJVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  size_t index;
  vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  stacks;
  thread shift_reduce_threads [3];
  vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  allocators;
  vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  local_e8;
  long alStack_d0 [4];
  ParseStack *local_b0;
  size_t *local_a8;
  size_t *local_a0;
  JSON *local_98;
  thread local_90;
  vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  local_88;
  BlockAllocator<MercuryJson::JsonValue> local_68;
  
  alStack_d0[1] = 0;
  alStack_d0[2] = 0;
  alStack_d0[3] = 0;
  local_88.
  super__Vector_base<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  ::reserve(&local_88,3);
  local_e8.
  super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  ._M_impl.super__Vector_impl_data._M_start = (ParseStack *)0x0;
  local_e8.
  super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  ::reserve(&local_e8,4);
  std::
  vector<MercuryJson::shift_reduce_impl::ParseStack,std::allocator<MercuryJson::shift_reduce_impl::ParseStack>>
  ::emplace_back<MercuryJson::BlockAllocator<MercuryJson::JsonValue>&>
            ((vector<MercuryJson::shift_reduce_impl::ParseStack,std::allocator<MercuryJson::shift_reduce_impl::ParseStack>>
              *)&local_e8,&this->allocator);
  iVar10 = 3;
  do {
    BlockAllocator<MercuryJson::JsonValue>::fork(&local_68);
    std::
    vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>>>
    ::emplace_back<MercuryJson::BlockAllocator<MercuryJson::JsonValue>>
              ((vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>>>
                *)&local_88,&local_68);
    BlockAllocator<MercuryJson::JsonValue>::~BlockAllocator(&local_68);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  lVar11 = 0;
  do {
    std::
    vector<MercuryJson::shift_reduce_impl::ParseStack,std::allocator<MercuryJson::shift_reduce_impl::ParseStack>>
    ::emplace_back<MercuryJson::BlockAllocator<MercuryJson::JsonValue>&>
              ((vector<MercuryJson::shift_reduce_impl::ParseStack,std::allocator<MercuryJson::shift_reduce_impl::ParseStack>>
                *)&local_e8,
               (BlockAllocator<MercuryJson::JsonValue> *)
               ((long)&(local_88.
                        super__Vector_base<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->ptr + lVar11));
    lVar11 = lVar11 + 0x38;
  } while (lVar11 != 0xa8);
  lVar12 = 2;
  lVar11 = 0x18;
  do {
    lVar7 = this->num_indices - 1;
    local_68.ptr = (char *)_thread_shift_reduce_parsing;
    local_68.all_memory.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0 = this->indices + ((ulong)((lVar12 + -1) * lVar7) >> 2);
    local_a8 = this->indices + ((ulong)(lVar7 * lVar12) >> 2);
    local_b0 = (ParseStack *)
               ((long)&(local_e8.
                        super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
                        ._M_impl.super__Vector_impl_data._M_start)->stack + lVar11);
    local_98 = this;
    std::thread::
    thread<void(MercuryJson::JSON::*)(unsigned_long_const*,unsigned_long_const*,MercuryJson::shift_reduce_impl::ParseStack*),MercuryJson::JSON*,unsigned_long*,unsigned_long*,MercuryJson::shift_reduce_impl::ParseStack*,void>
              (&local_90,(offset_in_JSON_to_subr *)&local_68,&local_98,&local_a0,&local_a8,&local_b0
              );
    if (alStack_d0[lVar12 + -1] != 0) goto LAB_0010fc91;
    ((id *)(alStack_d0 + lVar12 + -1))->_M_thread = (native_handle_type)local_90._M_id._M_thread;
    lVar12 = lVar12 + 1;
    lVar11 = lVar11 + 0x18;
  } while (lVar12 != 5);
  _thread_shift_reduce_parsing
            (this,this->indices,this->indices + (this->num_indices - 1 >> 2),
             local_e8.
             super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
             ._M_impl.super__Vector_impl_data._M_start);
  this_00 = local_e8.
            super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = 0;
  do {
    std::thread::join();
    lVar11 = lVar11 + 1;
    if (local_e8.
        super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar11].stack_top != 0) {
      pPVar1 = local_e8.
               super__Vector_base<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar11;
      index = 0;
      do {
        pJVar8 = pPVar1->stack[index];
        switch(pJVar8->type) {
        case TYPE_NULL:
        case TYPE_BOOL:
        case TYPE_STR:
        case TYPE_OBJ:
        case TYPE_ARR:
        case TYPE_INT:
        case TYPE_DEC:
switchD_0010fa3e_caseD_0:
          sVar2 = this_00->stack_top;
          this_00->stack_top = sVar2 + 1;
          this_00->stack[sVar2] = pJVar8;
          break;
        case TYPE_PARTIAL_OBJ:
          uVar9 = this_00->stack_top;
          if (((uVar9 < 2) || (this_00->stack[uVar9 - 2]->type != TYPE_PARTIAL_OBJ)) ||
             ((pJVar3 = this_00->stack[uVar9 - 1], pJVar3->type != TYPE_CHAR ||
              ((pJVar3->field_1).boolean != true)))) goto LAB_0010fb34;
          lVar12 = (this_00->stack[uVar9 - 2]->field_1).integer;
          *(anon_union_8_9_cf323b4b_for_JsonPartialValue_2 *)(*(long *)(lVar12 + 0x18) + 0x10) =
               pJVar8->field_1;
          *(undefined8 *)(lVar12 + 0x18) = *(undefined8 *)((pJVar8->field_1).integer + 0x18);
LAB_0010fb2b:
          this_00->stack_top = uVar9 - 1;
          break;
        case TYPE_PARTIAL_ARR:
          uVar9 = this_00->stack_top;
          if ((((1 < uVar9) && (this_00->stack[uVar9 - 2]->type == TYPE_PARTIAL_ARR)) &&
              (pJVar3 = this_00->stack[uVar9 - 1], pJVar3->type == TYPE_CHAR)) &&
             ((pJVar3->field_1).boolean == true)) {
            pJVar4 = (this_00->stack[uVar9 - 2]->field_1).object;
            pJVar4->next->value = (JsonValue *)pJVar8->field_1;
            pJVar4->next = ((pJVar8->field_1).object)->next;
            goto LAB_0010fb2b;
          }
LAB_0010fb34:
          this_00->stack_top = uVar9 + 1;
          this_00->stack[uVar9] = pJVar8;
          break;
        case TYPE_CHAR:
          args = (pJVar8->field_1).structural;
          if (args < 0x5d) {
            if (args != 0x2c) {
              if ((args != 0x3a) && (args != 0x5b)) {
LAB_0010fc06:
                _error(this,"JSON value",args,index);
              }
LAB_0010fb71:
              pJVar8 = BlockAllocator<MercuryJson::JsonValue>::
                       construct<MercuryJson::shift_reduce_impl::JsonPartialValue,char>
                                 (this_00->allocator,args);
              goto switchD_0010fa3e_caseD_0;
            }
            shift_reduce_impl::ParseStack::reduce_partial_array(this_00);
          }
          else if (args == 0x5d) {
            shift_reduce_impl::ParseStack::reduce_array(this_00);
          }
          else {
            if (args != 0x7d) {
              if (args != 0x7b) goto LAB_0010fc06;
              goto LAB_0010fb71;
            }
            shift_reduce_impl::ParseStack::reduce_object(this_00);
          }
        }
        do {
          bVar6 = shift_reduce_impl::ParseStack::reduce_partial_object(this_00);
        } while (bVar6);
        index = index + 1;
      } while (index < pPVar1->stack_top);
    }
  } while (lVar11 != 3);
  if (this_00->stack_top != 1) {
    __assert_fail("main_stack.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Somefive[P]MercuryJson/src/shift_reduce_parser.cpp"
                  ,0x208,"JsonValue *MercuryJson::JSON::_shift_reduce_parsing()");
  }
  pJVar5 = (JsonValue *)*this_00->stack;
  this->idx_ptr = this->idx_ptr + (this->num_indices - 1);
  std::
  vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  ::~vector(&local_e8);
  std::
  vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  ::~vector(&local_88);
  lVar11 = 0x18;
  while (*(long *)((long)alStack_d0 + lVar11) == 0) {
    lVar11 = lVar11 + -8;
    if (lVar11 == 0) {
      return pJVar5;
    }
  }
LAB_0010fc91:
  std::terminate();
}

Assistant:

JsonValue *JSON::_shift_reduce_parsing() {
        using shift_reduce_impl::JsonPartialValue;
        using shift_reduce_impl::JsonPartialObjectHead;
        using shift_reduce_impl::JsonPartialArrayHead;
        using shift_reduce_impl::ParseStack;

#if SHIFT_REDUCE_NUM_THREADS > 1
        std::thread shift_reduce_threads[SHIFT_REDUCE_NUM_THREADS - 1];
        std::vector<BlockAllocator<JsonValue>> allocators;
        allocators.reserve(SHIFT_REDUCE_NUM_THREADS - 1);
        std::vector<ParseStack> stacks;
        stacks.reserve(SHIFT_REDUCE_NUM_THREADS);
        stacks.emplace_back(allocator);
        size_t num_indices_per_thread = (num_indices - 1 + SHIFT_REDUCE_NUM_THREADS) / SHIFT_REDUCE_NUM_THREADS;
        for (int i = 0; i < SHIFT_REDUCE_NUM_THREADS - 1; ++i)
            allocators.push_back(allocator.fork(2 * num_indices_per_thread * sizeof(JsonPartialValue)));
        for (int i = 0; i < SHIFT_REDUCE_NUM_THREADS - 1; ++i)
            stacks.emplace_back(allocators[i]);
        for (int i = 0; i < SHIFT_REDUCE_NUM_THREADS - 1; ++i) {
            size_t idx_begin = (num_indices - 1) * (i + 1) / SHIFT_REDUCE_NUM_THREADS;
            size_t idx_end = (num_indices - 1) * (i + 2) / SHIFT_REDUCE_NUM_THREADS;
            shift_reduce_threads[i] = std::thread(&JSON::_thread_shift_reduce_parsing, this,
                                                  indices + idx_begin, indices + idx_end, &stacks[i + 1]);
        }
        size_t idx_end = (num_indices - 1) / SHIFT_REDUCE_NUM_THREADS;
        _thread_shift_reduce_parsing(indices, indices + idx_end, &stacks[0]);

        // Join threads and merge.
        ParseStack &main_stack = stacks[0];
//        main_stack.print();
        for (int i = 0; i < SHIFT_REDUCE_NUM_THREADS - 1; ++i) {
            shift_reduce_threads[i].join();
            ParseStack &merge_stack = stacks[i + 1];
//            merge_stack.print();
            for (size_t idx = 0; idx < merge_stack.size(); ++idx) {
                auto *value = merge_stack[idx];
                switch (value->type) {
                    case JsonPartialValue::TYPE_NULL:
                    case JsonPartialValue::TYPE_BOOL:
                    case JsonPartialValue::TYPE_STR:
                    case JsonPartialValue::TYPE_OBJ:
                    case JsonPartialValue::TYPE_ARR:
                    case JsonPartialValue::TYPE_INT:
                    case JsonPartialValue::TYPE_DEC:
                        main_stack.push(value);
                        break;
                    case JsonPartialValue::TYPE_PARTIAL_OBJ:
                        if (main_stack.check(JsonPartialValue::TYPE_PARTIAL_OBJ, ',')) {
                            // Merge with partial object from previous stack.
                            auto *prev_obj = static_cast<JsonPartialObjectHead *>(main_stack.get(2)->partial_object);
                            prev_obj->final->next = value->partial_object;
                            prev_obj->final = static_cast<JsonPartialObjectHead *>(value->partial_object)->final;
                            main_stack.pop(1);
                        } else {
                            main_stack.push(value);
                        }
                        break;
                    case JsonPartialValue::TYPE_PARTIAL_ARR:
                        if (main_stack.check(JsonPartialValue::TYPE_PARTIAL_ARR, ',')) {
                            // Merge with partial array from previous stack.
                            auto *prev_arr = static_cast<JsonPartialArrayHead *>(main_stack.get(2)->partial_array);
                            prev_arr->final->next = value->partial_array;
                            prev_arr->final = static_cast<JsonPartialArrayHead *>(value->partial_array)->final;
                            main_stack.pop(1);
                        } else {
                            main_stack.push(value);
                        }
                        break;
                    case JsonPartialValue::TYPE_CHAR:
                        switch (char ch = value->structural) {
                            case '{':
                            case '[':
                            case ':':
                                main_stack.push(ch);
                                break;

                                // Perform reduce on the stack.
                                // There will be at most two consecutive reduce ops:
                                //   1. From a partial array to array, or from a partial object to object.
                                //   2. Merge the previously constructed value with a partial array or partial object.
                            case '}':
                                // "{", partial-object, "}"  =>  object
                                main_stack.reduce_object();
                                break;
                            case ']':
                                // "[", partial-array, "]"  =>  array
                                main_stack.reduce_array();
                                break;
                            case ',':
                                // value, ","  =>  partial-array
                                main_stack.reduce_partial_array();
                                break;
                            default:
                                error("JSON value");
                        }
                        break;
                }
                while (main_stack.reduce_partial_object()) {}
            }
        }
#else
        ParseStack main_stack(allocator);
        _thread_shift_reduce_parsing(indices, indices + num_indices - 1, &main_stack);
#endif
//        main_stack.print();
        assert(main_stack.size() == 1);
        auto *ret = reinterpret_cast<JsonValue *>(main_stack[0]);
        idx_ptr += num_indices - 1;  // Consume the indices to satisfy null ending check.

        return ret;
    }